

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BrokerBase.cpp
# Opt level: O2

void __thiscall helics::BrokerBase::addActionMessage(BrokerBase *this,ActionMessage *message)

{
  atomic<bool> *this_00;
  bool bVar1;
  vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *this_01;
  bool bStack_41;
  unique_lock<std::mutex> uStack_40;
  unique_lock<std::mutex> uStack_30;
  
  if (message->messageAction < cmd_ignore) {
    gmlc::containers::
    BlockingPriorityQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
    emplacePriority<helics::ActionMessage>(&this->actionQueue,message);
    return;
  }
  std::unique_lock<std::mutex>::unique_lock(&uStack_40,(mutex_type *)&this->actionQueue);
  this_01 = &(this->actionQueue).pushElements;
  if ((this->actionQueue).pushElements.
      super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->actionQueue).pushElements.
      super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bStack_41 = true;
    this_00 = &(this->actionQueue).queueEmptyFlag;
    bVar1 = std::atomic<bool>::compare_exchange_strong
                      ((atomic<bool> *)this_00,&bStack_41,false,seq_cst);
    if (bVar1) {
      std::unique_lock<std::mutex>::unlock(&uStack_40);
      std::unique_lock<std::mutex>::unique_lock
                (&uStack_30,(mutex_type *)&(this->actionQueue).m_pullLock);
      LOCK();
      (this->actionQueue).queueEmptyFlag._M_base._M_i = false;
      UNLOCK();
      if ((this->actionQueue).pullElements.
          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Vector_impl_data._M_start ==
          (this->actionQueue).pullElements.
          super__Vector_base<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        this_01 = &(this->actionQueue).pullElements;
      }
      else {
        std::unique_lock<std::mutex>::lock(&uStack_40);
      }
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
      emplace_back<helics::ActionMessage>
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_01,
                 message);
      std::condition_variable::notify_all();
      std::unique_lock<std::mutex>::~unique_lock(&uStack_30);
    }
    else {
      std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
      emplace_back<helics::ActionMessage>
                ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_01,
                 message);
      bStack_41 = true;
      bVar1 = std::atomic<bool>::compare_exchange_strong
                        ((atomic<bool> *)this_00,&bStack_41,false,seq_cst);
      if (bVar1) {
        std::condition_variable::notify_all();
      }
    }
  }
  else {
    std::vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::
    emplace_back<helics::ActionMessage>
              ((vector<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)this_01,
               message);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_40);
  return;
}

Assistant:

void BrokerBase::addActionMessage(ActionMessage&& message) const
{
    // the queue is thread safe so can be run in a const situation without possibility of issues
    auto& lQueue = const_cast<decltype(actionQueue)&>(actionQueue);
    if (isPriorityCommand(message)) {
        lQueue.emplacePriority(std::move(message));
    } else {
        // just route to the general queue;
        lQueue.emplace(std::move(message));
    }
}